

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O3

bech32_bstring * bech32_create_bstring(size_t hrplen,size_t dplen)

{
  bech32_bstring *__ptr;
  char *pcVar1;
  
  if ((hrplen != 0) && (__ptr = (bech32_bstring *)malloc(0x10), __ptr != (bech32_bstring *)0x0)) {
    __ptr->length = hrplen + dplen + 7;
    pcVar1 = (char *)calloc(hrplen + dplen + 8,1);
    __ptr->string = pcVar1;
    if (pcVar1 != (char *)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (bech32_bstring *)0x0;
}

Assistant:

bech32_bstring * bech32_create_bstring(size_t hrplen, size_t dplen) {
    if(hrplen < 1)
        return nullptr;
    auto *bstring = static_cast<bech32_bstring *>(malloc(sizeof(bech32_bstring)));
    if(bstring == nullptr)
        return nullptr;
    bstring->length = bech32_compute_encoded_string_length(hrplen, dplen);
    bstring->string = static_cast<char *>(calloc(bstring->length + 1, 1)); // +1 for '\0'
    if(bstring->string == nullptr) {
        bech32_free_bstring(bstring);
        return nullptr;
    }
    return bstring;
}